

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChTimestepperHHT.cpp
# Opt level: O1

void __thiscall chrono::ChTimestepperHHT::ArchiveIN(ChTimestepperHHT *this,ChArchiveIn *archive)

{
  HHT_Mode_mapper modemapper;
  HHT_Mode_mapper local_80;
  ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode> local_60;
  char *local_40;
  ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode> *local_38;
  undefined1 local_30;
  
  ChArchiveIn::VersionRead<chrono::ChTimestepperHHT>(archive);
  ChTimestepper::ArchiveIN((ChTimestepper *)this,archive);
  ChImplicitIterativeTimestepper::ArchiveIN(&this->super_ChImplicitIterativeTimestepper,archive);
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.value_ptr =
       (HHT_Mode *)&this->alpha;
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x998822;
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)archive + 0x20))(archive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.value_ptr =
       (HHT_Mode *)&this->beta;
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0x9919b7;
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)archive + 0x20))(archive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.value_ptr =
       (HHT_Mode *)&this->gamma;
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0xa0e1fc;
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)archive + 0x20))(archive,&local_80);
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.value_ptr =
       (HHT_Mode *)&this->scaling;
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)0xa0eb4b;
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.enummap.
  super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0;
  (**(code **)(*(long *)archive + 0x10))(archive,&local_80);
  my_enum_mappers::HHT_Mode_mapper::HHT_Mode_mapper(&local_80);
  my_enum_mappers::HHT_Mode_mapper::operator()(&local_60,&local_80,&this->mode);
  local_40 = "mode";
  local_30 = 0;
  local_38 = &local_60;
  (**(code **)(*(long *)archive + 0x58))(archive);
  local_60.super_ChEnumMapperBase._vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b6c098
  ;
  if (local_60.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_60.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.super_ChEnumMapperBase.
  _vptr_ChEnumMapperBase = (_func_int **)&PTR_GetValueAsInt_00b6c098;
  if (local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.enummap.
      super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_80.super_ChEnumMapper<chrono::ChTimestepperHHT::HHT_Mode>.enummap.
               super___shared_ptr<std::vector<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>,_std::allocator<chrono::ChEnumNamePair<chrono::ChTimestepperHHT::HHT_Mode>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void ChTimestepperHHT::ArchiveIN(ChArchiveIn& archive) {
    // version number
    /*int version =*/ archive.VersionRead<ChTimestepperHHT>();
    // deserialize parent class:
    ChTimestepperIIorder::ArchiveIN(archive);
    ChImplicitIterativeTimestepper::ArchiveIN(archive);
    // stream in all member data:
    archive >> CHNVP(alpha);
    archive >> CHNVP(beta);
    archive >> CHNVP(gamma);
    archive >> CHNVP(scaling);
    my_enum_mappers::HHT_Mode_mapper modemapper;
    archive >> CHNVP(modemapper(mode), "mode");
}